

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

_Bool arm_cpu_exec_interrupt_aarch64(CPUState *cs,int interrupt_request)

{
  CPUClass *pCVar1;
  CPUARMState_conflict *env;
  _Bool _Var2;
  _Bool _Var3;
  uint uVar4;
  uint32_t target_el;
  uint64_t hcr_el2;
  int32_t iVar5;
  uint uVar6;
  uint32_t cur_el;
  
  pCVar1 = cs->cc;
  env = (CPUARMState_conflict *)cs->env_ptr;
  uVar6 = (uint)env->features;
  if ((uVar6 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar4 = env->uncached_cpsr & 0x1f;
      if (uVar4 == 0x10) {
        cur_el = 0;
      }
      else if (uVar4 == 0x16) {
        cur_el = 3;
      }
      else if (uVar4 == 0x1a) {
        cur_el = 2;
      }
      else {
        _Var2 = arm_is_secure(env);
        cur_el = 1;
        if ((uVar6 >> 0x1c & 1) == 0) {
          cur_el = _Var2 + 1 + (uint)_Var2;
        }
      }
    }
    else {
      cur_el = env->pstate >> 2 & 3;
    }
  }
  else if ((env->v7m).exception == 0) {
    cur_el = ~(env->v7m).control[(env->v7m).secure] & 1;
  }
  else {
    cur_el = 1;
  }
  _Var2 = arm_is_secure(env);
  hcr_el2 = arm_hcr_el2_eff_aarch64(env);
  if ((interrupt_request & 0x10U) != 0) {
    iVar5 = 6;
    target_el = arm_phys_excp_target_el_aarch64(cs,6,cur_el,_Var2);
    _Var3 = arm_excp_unmasked(cs,6,target_el,cur_el,_Var2,hcr_el2);
    if (_Var3) goto LAB_005a0502;
  }
  if ((interrupt_request & 2U) != 0) {
    iVar5 = 5;
    target_el = arm_phys_excp_target_el_aarch64(cs,5,cur_el,_Var2);
    _Var3 = arm_excp_unmasked(cs,5,target_el,cur_el,_Var2,hcr_el2);
    if (_Var3) goto LAB_005a0502;
  }
  if (((((interrupt_request & 0x40U) == 0) || (1 < cur_el)) ||
      (((uint)hcr_el2 & 0x8000010) != 0x10 || _Var2)) ||
     ((*(byte *)((long)cs->env_ptr + 0x230) & 0x80) != 0)) {
    if (((((uint)interrupt_request >> 9 & 1) == 0) || (1 < cur_el)) ||
       ((_Var2 || ((uint)hcr_el2 & 0x8000008) != 8 ||
        ((*(byte *)((long)cs->env_ptr + 0x230) & 0x40) != 0)))) {
      return false;
    }
    iVar5 = 0xf;
  }
  else {
    iVar5 = 0xe;
  }
  target_el = 1;
LAB_005a0502:
  cs->exception_index = iVar5;
  (env->exception).target_el = target_el;
  (*pCVar1->do_interrupt)((CPUState_conflict *)cs);
  return true;
}

Assistant:

bool arm_cpu_exec_interrupt(CPUState *cs, int interrupt_request)
{
    CPUClass *cc = CPU_GET_CLASS(cs);
    CPUARMState *env = cs->env_ptr;
    uint32_t cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);
    uint64_t hcr_el2 = arm_hcr_el2_eff(env);
    uint32_t target_el;
    uint32_t excp_idx;

    /* The prioritization of interrupts is IMPLEMENTATION DEFINED. */

    if (interrupt_request & CPU_INTERRUPT_FIQ) {
        excp_idx = EXCP_FIQ;
        target_el = arm_phys_excp_target_el(cs, excp_idx, cur_el, secure);
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    if (interrupt_request & CPU_INTERRUPT_HARD) {
        excp_idx = EXCP_IRQ;
        target_el = arm_phys_excp_target_el(cs, excp_idx, cur_el, secure);
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    if (interrupt_request & CPU_INTERRUPT_VIRQ) {
        excp_idx = EXCP_VIRQ;
        target_el = 1;
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    if (interrupt_request & CPU_INTERRUPT_VFIQ) {
        excp_idx = EXCP_VFIQ;
        target_el = 1;
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    return false;

 found:
    cs->exception_index = excp_idx;
    env->exception.target_el = target_el;
    cc->do_interrupt(cs);
    return true;
}